

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbmp.cpp
# Opt level: O2

BMP * BMP_Create(unsigned_long width,unsigned_long height,unsigned_short depth)

{
  BMP *__ptr;
  long lVar1;
  uchar *__ptr_00;
  uchar *puVar2;
  ulong uVar3;
  undefined2 in_register_00000012;
  long lVar4;
  size_t __nmemb;
  
  if (width == 0 || height == 0) {
    BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
    return (BMP *)0x0;
  }
  if ((0x20 < depth) || ((0x101000100U >> ((ulong)depth & 0x3f) & 1) == 0)) {
    BMP_LAST_ERROR_CODE = BMP_FILE_NOT_SUPPORTED;
    return (BMP *)0x0;
  }
  __ptr = (BMP *)calloc(1,0x80);
  if (__ptr == (BMP *)0x0) {
    BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
    return (BMP *)0x0;
  }
  lVar1 = (CONCAT22(in_register_00000012,depth) >> 3 & 0xffff) * width;
  uVar3 = (ulong)((uint)lVar1 & 3);
  lVar4 = 4 - uVar3;
  if (uVar3 == 0) {
    lVar4 = 0;
  }
  __nmemb = (lVar4 + lVar1) * height;
  lVar4 = (ulong)(depth == 8) * 0x400;
  (__ptr->Header).Magic = 0x4d42;
  (__ptr->Header).HeaderSize = 0x28;
  (__ptr->Header).Planes = 1;
  (__ptr->Header).Width = width;
  (__ptr->Header).Height = height;
  (__ptr->Header).BitsPerPixel = depth;
  (__ptr->Header).ImageDataSize = __nmemb;
  (__ptr->Header).FileSize = lVar4 + __nmemb + 0x36;
  (__ptr->Header).DataOffset = lVar4 + 0x36;
  if (depth == 8) {
    __ptr_00 = (uchar *)calloc(0x400,1);
    __ptr->Palette = __ptr_00;
    if (__ptr_00 == (uchar *)0x0) {
      BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
      goto LAB_00105026;
    }
  }
  else {
    __ptr_00 = (uchar *)0x0;
  }
  puVar2 = (uchar *)calloc(__nmemb,1);
  __ptr->Data = puVar2;
  if (puVar2 != (uchar *)0x0) {
    BMP_LAST_ERROR_CODE = BMP_OK;
    return __ptr;
  }
  BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
  free(__ptr_00);
LAB_00105026:
  free(__ptr);
  return (BMP *)0x0;
}

Assistant:

BMP* BMP_Create( UINT width, UINT height, USHORT depth )
{
	BMP*	bmp;
	int		bytes_per_pixel = depth >> 3;
	UINT	bytes_per_row;

	if ( height <= 0 || width <= 0 )
	{
		BMP_LAST_ERROR_CODE = BMP_INVALID_ARGUMENT;
		return NULL;
	}

	if ( depth != 8 && depth != 24 && depth != 32 )
	{
		BMP_LAST_ERROR_CODE = BMP_FILE_NOT_SUPPORTED;
		return NULL;
	}


	/* Allocate the bitmap data structure */
	bmp = (BMP*)calloc( 1, sizeof( BMP ) );
	if ( bmp == NULL )
	{
		BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
		return NULL;
	}


	/* Set header' default values */
	bmp->Header.Magic				= 0x4D42;
	bmp->Header.Reserved1			= 0;
	bmp->Header.Reserved2			= 0;
	bmp->Header.HeaderSize			= 40;
	bmp->Header.Planes				= 1;
	bmp->Header.CompressionType		= 0;
	bmp->Header.HPixelsPerMeter		= 0;
	bmp->Header.VPixelsPerMeter		= 0;
	bmp->Header.ColorsUsed			= 0;
	bmp->Header.ColorsRequired		= 0;


	/* Calculate the number of bytes used to store a single image row. This is always
	rounded up to the next multiple of 4. */
	bytes_per_row = width * bytes_per_pixel;
	bytes_per_row += ( bytes_per_row % 4 ? 4 - bytes_per_row % 4 : 0 );


	/* Set header's image specific values */
	bmp->Header.Width				= width;
	bmp->Header.Height				= height;
	bmp->Header.BitsPerPixel		= depth;
	bmp->Header.ImageDataSize		= bytes_per_row * height;
	bmp->Header.FileSize			= bmp->Header.ImageDataSize + 54 + ( depth == 8 ? BMP_PALETTE_SIZE : 0 );
	bmp->Header.DataOffset			= 54 + ( depth == 8 ? BMP_PALETTE_SIZE : 0 );


	/* Allocate palette */
	if ( bmp->Header.BitsPerPixel == 8 )
	{
		bmp->Palette = (UCHAR*) calloc( BMP_PALETTE_SIZE, sizeof( UCHAR ) );
		if ( bmp->Palette == NULL )
		{
			BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
			free( bmp );
			return NULL;
		}
	}
	else
	{
		bmp->Palette = NULL;
	}


	/* Allocate pixels */
	bmp->Data = (UCHAR*) calloc( bmp->Header.ImageDataSize, sizeof( UCHAR ) );
	if ( bmp->Data == NULL )
	{
		BMP_LAST_ERROR_CODE = BMP_OUT_OF_MEMORY;
		free( bmp->Palette );
		free( bmp );
		return NULL;
	}


	BMP_LAST_ERROR_CODE = BMP_OK;

	return bmp;
}